

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,MessageLite *extendee,int number,Extension *other_extension,
          Arena *other_arena)

{
  long *plVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  CppType CVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  bool *pbVar5;
  bool *pbVar6;
  MessageLite *pMVar7;
  LogMessage local_108;
  Voidify local_f1;
  LogMessage local_f0;
  Voidify local_d9;
  Nullable<const_char_*> local_d8;
  Nullable<const_char_*> absl_log_internal_check_op_result_3;
  Voidify local_bb;
  uchar local_ba;
  uchar local_b9;
  Nullable<const_char_*> local_b8;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  LogMessage local_a8;
  Voidify local_91;
  LogMessage local_90;
  Voidify local_79;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_60;
  Voidify local_4b;
  uchar local_4a;
  uchar local_49;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *pEStack_38;
  bool is_new;
  Extension *dst_extension;
  Arena *other_arena_local;
  Extension *other_extension_local;
  MessageLite *pMStack_18;
  int number_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  dst_extension = (Extension *)other_arena;
  other_arena_local = (Arena *)other_extension;
  other_extension_local._4_4_ = number;
  pMStack_18 = extendee;
  extendee_local = (MessageLite *)this;
  absl_log_internal_check_op_result._7_1_ =
       MaybeNewExtension(this,number,other_extension->descriptor,&stack0xffffffffffffffc8);
  if ((bool)absl_log_internal_check_op_result._7_1_) {
    InternalExtensionMergeFromIntoUninitializedExtension
              (this,pEStack_38,pMStack_18,other_extension_local._4_4_,(Extension *)other_arena_local
               ,(Arena *)dst_extension);
  }
  else if (((other_arena_local->impl_).alloc_policy_.policy_ & 0x100) == 0) {
    if ((*(byte *)((long)&(other_arena_local->impl_).alloc_policy_.policy_ + 2) >> 1 & 1) == 0) {
      pEStack_38->field_0xa = pEStack_38->field_0xa & 0xfd;
      CVar2 = anon_unknown_59::cpp_type((FieldType)(other_arena_local->impl_).alloc_policy_.policy_)
      ;
      switch(CVar2) {
      case CPPTYPE_INT32:
        (pEStack_38->field_0).int32_t_value = (int32_t)(other_arena_local->impl_).tag_and_id_;
        break;
      case CPPTYPE_INT64:
        pEStack_38->field_0 =
             (anon_union_8_9_fdc4a54a_for_Extension_0)(other_arena_local->impl_).tag_and_id_;
        break;
      case CPPTYPE_UINT32:
        (pEStack_38->field_0).int32_t_value = (int32_t)(other_arena_local->impl_).tag_and_id_;
        break;
      case CPPTYPE_UINT64:
        pEStack_38->field_0 =
             (anon_union_8_9_fdc4a54a_for_Extension_0)(other_arena_local->impl_).tag_and_id_;
        break;
      case CPPTYPE_DOUBLE:
        pEStack_38->field_0 =
             (anon_union_8_9_fdc4a54a_for_Extension_0)(other_arena_local->impl_).tag_and_id_;
        break;
      case CPPTYPE_FLOAT:
        (pEStack_38->field_0).int32_t_value = (int32_t)(other_arena_local->impl_).tag_and_id_;
        break;
      case CPPTYPE_BOOL:
        (pEStack_38->field_0).bool_value = (bool)((byte)(other_arena_local->impl_).tag_and_id_ & 1);
        break;
      case CPPTYPE_ENUM:
        (pEStack_38->field_0).int32_t_value = (int32_t)(other_arena_local->impl_).tag_and_id_;
        break;
      case CPPTYPE_STRING:
        std::__cxx11::string::assign((string *)pEStack_38->field_0);
        break;
      case CPPTYPE_MESSAGE:
        local_b9 = absl::lts_20250127::log_internal::GetReferenceableValue(pEStack_38->type);
        local_ba = absl::lts_20250127::log_internal::GetReferenceableValue
                             ((uchar)(other_arena_local->impl_).alloc_policy_.policy_);
        local_b8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_char>
                             (&local_b9,&local_ba,"dst_extension->type == other_extension.type");
        if (local_b8 != (Nullable<const_char_*>)0x0) {
          pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_b8);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,0x496,pcVar3);
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                             ((LogMessage *)&absl_log_internal_check_op_result_3);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_bb,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_3);
        }
        pbVar5 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>
                           (&pEStack_38->is_packed);
        pbVar6 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>
                           ((bool *)((long)&(other_arena_local->impl_).alloc_policy_.policy_ + 3));
        local_d8 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                             (pbVar5,pbVar6,"dst_extension->is_packed == other_extension.is_packed")
        ;
        if (local_d8 != (Nullable<const_char_*>)0x0) {
          pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_d8);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,0x497,pcVar3);
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f0);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_d9,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_f0);
        }
        if ((pEStack_38->is_repeated & 1U) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,0x498,"!dst_extension->is_repeated");
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_108);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_f1,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_108);
        }
        if ((*(byte *)((long)&(other_arena_local->impl_).alloc_policy_.policy_ + 2) >> 2 & 1) == 0)
        {
          if (((byte)pEStack_38->field_0xa >> 2 & 1) == 0) {
            MessageLite::CheckTypeAndMergeFrom
                      ((MessageLite *)pEStack_38->field_0,
                       (MessageLite *)(other_arena_local->impl_).tag_and_id_);
          }
          else {
            pMVar7 = (MessageLite *)
                     (**(code **)(**(long **)&(pEStack_38->field_0).int32_t_value + 0x28))
                               (*(long **)&(pEStack_38->field_0).int32_t_value,
                                (other_arena_local->impl_).tag_and_id_,this->arena_);
            MessageLite::CheckTypeAndMergeFrom
                      (pMVar7,(MessageLite *)(other_arena_local->impl_).tag_and_id_);
          }
        }
        else if (((byte)pEStack_38->field_0xa >> 2 & 1) == 0) {
          this_00 = pEStack_38->field_0;
          plVar1 = (long *)(other_arena_local->impl_).tag_and_id_;
          pMVar7 = (MessageLite *)
                   (**(code **)(*plVar1 + 0x18))
                             (plVar1,(pEStack_38->field_0).int64_t_value,dst_extension);
          MessageLite::CheckTypeAndMergeFrom((MessageLite *)this_00,pMVar7);
        }
        else {
          plVar1 = *(long **)&(pEStack_38->field_0).int32_t_value;
          pMVar7 = GetPrototypeForLazyMessage(this,pMStack_18,other_extension_local._4_4_);
          (**(code **)(*plVar1 + 0x80))
                    (plVar1,pMVar7,(other_arena_local->impl_).tag_and_id_,this->arena_,dst_extension
                    );
        }
      }
    }
  }
  else {
    local_49 = absl::lts_20250127::log_internal::GetReferenceableValue(pEStack_38->type);
    local_4a = absl::lts_20250127::log_internal::GetReferenceableValue
                         ((uchar)(other_arena_local->impl_).alloc_policy_.policy_);
    local_48 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_char>
                         (&local_49,&local_4a,"dst_extension->type == other_extension.type");
    if (local_48 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_48);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x464,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_4b,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    pbVar5 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&pEStack_38->is_packed);
    pbVar6 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>
                       ((bool *)((long)&(other_arena_local->impl_).alloc_policy_.policy_ + 3));
    local_78 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                         (pbVar5,pbVar6,"dst_extension->is_packed == other_extension.is_packed");
    if (local_78 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_78);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x465,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    absl_log_internal_check_op_result_2._7_1_ = 0;
    if (((pEStack_38->is_repeated ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x466,"dst_extension->is_repeated");
      absl_log_internal_check_op_result_2._7_1_ = 1;
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar4);
    }
    if ((absl_log_internal_check_op_result_2._7_1_ & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
    CVar2 = anon_unknown_59::cpp_type((FieldType)(other_arena_local->impl_).alloc_policy_.policy_);
    switch(CVar2) {
    case CPPTYPE_INT32:
      RepeatedField<int>::MergeFrom
                ((RepeatedField<int> *)pEStack_38->field_0,
                 (RepeatedField<int> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_INT64:
      RepeatedField<long>::MergeFrom
                ((RepeatedField<long> *)pEStack_38->field_0,
                 (RepeatedField<long> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_UINT32:
      RepeatedField<unsigned_int>::MergeFrom
                ((RepeatedField<unsigned_int> *)pEStack_38->field_0,
                 (RepeatedField<unsigned_int> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_UINT64:
      RepeatedField<unsigned_long>::MergeFrom
                ((RepeatedField<unsigned_long> *)pEStack_38->field_0,
                 (RepeatedField<unsigned_long> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_DOUBLE:
      RepeatedField<double>::MergeFrom
                ((RepeatedField<double> *)pEStack_38->field_0,
                 (RepeatedField<double> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_FLOAT:
      RepeatedField<float>::MergeFrom
                ((RepeatedField<float> *)pEStack_38->field_0,
                 (RepeatedField<float> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_BOOL:
      RepeatedField<bool>::MergeFrom
                ((RepeatedField<bool> *)pEStack_38->field_0,
                 (RepeatedField<bool> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_ENUM:
      RepeatedField<int>::MergeFrom
                ((RepeatedField<int> *)pEStack_38->field_0,
                 (RepeatedField<int> *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_STRING:
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pEStack_38->field_0,
                  (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(other_arena_local->impl_).tag_and_id_);
      break;
    case CPPTYPE_MESSAGE:
      RepeatedPtrField<google::protobuf::MessageLite>::MergeFrom
                ((RepeatedPtrField<google::protobuf::MessageLite> *)pEStack_38->field_0,
                 (RepeatedPtrField<google::protobuf::MessageLite> *)
                 (other_arena_local->impl_).tag_and_id_);
    }
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(const MessageLite* extendee,
                                              int number,
                                              const Extension& other_extension,
                                              Arena* other_arena) {
  Extension* dst_extension;
  bool is_new =
      MaybeNewExtension(number, other_extension.descriptor, &dst_extension);
  if (is_new) {
    InternalExtensionMergeFromIntoUninitializedExtension(
        *dst_extension, extendee, number, other_extension, other_arena);
    return;
  }
  if (other_extension.is_repeated) {
    ABSL_DCHECK_EQ(dst_extension->type, other_extension.type);
    ABSL_DCHECK_EQ(dst_extension->is_packed, other_extension.is_packed);
    ABSL_DCHECK(dst_extension->is_repeated);

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                       \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                     \
    dst_extension->ptr.repeated_##LOWERCASE##_value->MergeFrom( \
        *other_extension.ptr.repeated_##LOWERCASE##_value);     \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
    return;
  }

  if (other_extension.is_cleared) {
    return;
  }
  dst_extension->is_cleared = false;
  switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                 \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                               \
    dst_extension->LOWERCASE##_value = other_extension.LOWERCASE##_value; \
    break;

    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
#undef HANDLE_TYPE
    case WireFormatLite::CPPTYPE_STRING:
      dst_extension->ptr.string_value->assign(
          *other_extension.ptr.string_value);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE: {
      ABSL_DCHECK_EQ(dst_extension->type, other_extension.type);
      ABSL_DCHECK_EQ(dst_extension->is_packed, other_extension.is_packed);
      ABSL_DCHECK(!dst_extension->is_repeated);
      if (other_extension.is_lazy) {
        if (dst_extension->is_lazy) {
          dst_extension->ptr.lazymessage_value->MergeFrom(
              GetPrototypeForLazyMessage(extendee, number),
              *other_extension.ptr.lazymessage_value, arena_, other_arena);
        } else {
          dst_extension->ptr.message_value->CheckTypeAndMergeFrom(
              other_extension.ptr.lazymessage_value->GetMessage(
                  *dst_extension->ptr.message_value, other_arena));
        }
      } else {
        if (dst_extension->is_lazy) {
          dst_extension->ptr.lazymessage_value
              ->MutableMessage(*other_extension.ptr.message_value, arena_)
              ->CheckTypeAndMergeFrom(*other_extension.ptr.message_value);
        } else {
          dst_extension->ptr.message_value->CheckTypeAndMergeFrom(
              *other_extension.ptr.message_value);
        }
      }
      break;
    }
  }
}